

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

bool __thiscall anon_unknown.dwarf_5f811d::Db::consumeIf(Db *this,StringView S)

{
  char *__s2;
  bool bVar1;
  int iVar2;
  char *__s1;
  ulong __n;
  
  __s1 = S.First;
  __s2 = this->First;
  __n = (long)S.Last - (long)__s1;
  if ((ulong)((long)this->Last - (long)__s2) < __n) {
LAB_001e3648:
    bVar1 = false;
  }
  else {
    if (S.Last != __s1) {
      iVar2 = bcmp(__s1,__s2,__n);
      if (iVar2 != 0) goto LAB_001e3648;
    }
    this->First = __s2 + __n;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool consumeIf(StringView S) {
    if (StringView(First, Last).startsWith(S)) {
      First += S.size();
      return true;
    }
    return false;
  }